

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>::
call_matcher<float,char_const(&)[5]>
          (call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>> *this
          ,char *file,unsigned_long line,char *call_string,float *u,char (*u_1) [5])

{
  undefined8 in_RAX;
  
  *(call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>> **)
   (this + 8) = this;
  *(call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>> **)
   (this + 0x10) = this;
  *(char **)(this + 0x18) = file;
  *(unsigned_long *)(this + 0x20) = line;
  *(char **)(this + 0x28) = call_string;
  *(undefined ***)this = &PTR__call_matcher_003d0ad8;
  *(undefined **)(this + 0x30) = &DAT_003d0b40;
  *(call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>> **)
   (this + 0x40) = this + 0x38;
  *(call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>> **)
   (this + 0x48) = this + 0x38;
  *(undefined ***)(this + 0x38) = &PTR__list_003d0bc0;
  *(call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>> **)
   (this + 0x58) = this + 0x50;
  *(call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>> **)
   (this + 0x60) = this + 0x50;
  *(undefined ***)(this + 0x50) = &PTR__list_003d0c48;
  *(undefined8 *)(this + 0x68) = 0;
  std::make_unique<trompeloeil::sequence_handler<0ul>>();
  *(undefined8 *)(this + 0x70) = in_RAX;
  *(char (**) [5])(this + 0x78) = u_1;
  *(float *)(this + 0x80) = *u;
  this[0x88] = (call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>)
               0x0;
  return;
}

Assistant:

call_matcher(
      char const *file,
      unsigned long line,
      char const *call_string,
      U &&... u)
    : call_matcher_base<Sig>(location{file, line}, call_string)
    , val(std::forward<U>(u)...)
    {}